

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

string * __thiscall
google::protobuf::internal::ExtensionSet::AddString_abi_cxx11_
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor)

{
  byte bVar1;
  int iVar2;
  Arena *pAVar3;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  _Var4;
  LogMessage *pLVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_bool>
  pVar8;
  LogFinisher local_d1;
  LogMessage local_d0;
  LogMessage local_98;
  LogMessage local_60;
  
  local_d0.filename_ = (char *)0x0;
  local_d0.line_ = 0;
  local_d0._20_4_ = 0;
  local_d0.message_._M_dataplus._M_p = (pointer)0x0;
  local_d0.level_ = number;
  pVar8 = std::
          _Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
          ::_M_emplace_unique<std::pair<int,google::protobuf::internal::ExtensionSet::Extension>>
                    ((_Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                      *)this,(pair<int,_google::protobuf::internal::ExtensionSet::Extension> *)
                             &local_d0);
  _Var4 = pVar8.first._M_node;
  _Var4._M_node[1]._M_right = (_Base_ptr)descriptor;
  if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (*(char *)((long)&_Var4._M_node[1]._M_left + 1) == '\0') {
      LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x217);
      pLVar5 = LogMessage::operator<<
                         (&local_98,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED : OPTIONAL) == (REPEATED): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_d0,pLVar5);
      LogMessage::~LogMessage(&local_98);
    }
    bVar1 = *(byte *)&_Var4._M_node[1]._M_left;
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_d0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x34);
      pLVar5 = LogMessage::operator<<
                         (&local_d0,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&local_60,pLVar5);
      LogMessage::~LogMessage(&local_d0);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 9) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x217);
      pLVar5 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_STRING): "
                         );
      LogFinisher::operator=(&local_d1,pLVar5);
      LogMessage::~LogMessage(&local_60);
    }
  }
  else {
    *(FieldType *)&_Var4._M_node[1]._M_left = type;
    if ((byte)(type - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_d0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x34);
      pLVar5 = LogMessage::operator<<
                         (&local_d0,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&local_98,pLVar5);
      LogMessage::~LogMessage(&local_d0);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) != 9) {
      LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x211);
      pLVar5 = LogMessage::operator<<
                         (&local_98,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_STRING): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_60,pLVar5);
      LogMessage::~LogMessage(&local_98);
    }
    *(undefined1 *)((long)&_Var4._M_node[1]._M_left + 1) = 1;
    *(undefined1 *)((long)&_Var4._M_node[1]._M_left + 3) = 0;
    pAVar3 = this->arena_;
    if (pAVar3 == (Arena *)0x0) {
      p_Var6 = (_Base_ptr)operator_new(0x18);
      *(undefined8 *)p_Var6 = 0;
      p_Var6->_M_parent = (_Base_ptr)0x0;
      p_Var6->_M_left = (_Base_ptr)0x0;
    }
    else {
      p_Var6 = (_Base_ptr)
               Arena::AllocateAligned
                         (pAVar3,(type_info *)&RepeatedPtrField<std::__cxx11::string>::typeinfo,0x18
                         );
      *(Arena **)p_Var6 = pAVar3;
      p_Var6->_M_parent = (_Base_ptr)0x0;
      p_Var6->_M_left = (_Base_ptr)0x0;
      Arena::AddListNode(pAVar3,p_Var6,
                         arena_destruct_object<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                        );
    }
    _Var4._M_node[1]._M_parent = p_Var6;
  }
  p_Var6 = _Var4._M_node[1]._M_parent;
  p_Var7 = p_Var6->_M_left;
  if (p_Var7 != (_Base_ptr)0x0) {
    iVar2 = *(int *)&p_Var6->_M_parent;
    if (iVar2 < (int)p_Var7->_M_color) {
      *(int *)&p_Var6->_M_parent = iVar2 + 1;
      return (string *)(&p_Var7->_M_parent)[iVar2];
    }
    if (p_Var7->_M_color != *(int *)((long)&p_Var6->_M_parent + 4)) goto LAB_005ef6ab;
  }
  RepeatedPtrFieldBase::Reserve
            ((RepeatedPtrFieldBase *)p_Var6,*(int *)((long)&p_Var6->_M_parent + 4) + 1);
LAB_005ef6ab:
  p_Var6->_M_left->_M_color = p_Var6->_M_left->_M_color + _S_black;
  pAVar3 = *(Arena **)p_Var6;
  if (pAVar3 == (Arena *)0x0) {
    p_Var7 = (_Base_ptr)operator_new(0x20);
    ((_Alloc_hider *)&p_Var7->_M_color)->_M_p = (pointer)&p_Var7->_M_left;
    p_Var7->_M_parent = (_Base_ptr)0x0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&p_Var7->_M_left)->_M_local_buf[0] = '\0';
  }
  else {
    p_Var7 = (_Base_ptr)
             Arena::AllocateAligned(pAVar3,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    ((_Alloc_hider *)&p_Var7->_M_color)->_M_p = (pointer)&p_Var7->_M_left;
    p_Var7->_M_parent = (_Base_ptr)0x0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&p_Var7->_M_left)->_M_local_buf[0] = '\0';
    Arena::AddListNode(pAVar3,p_Var7,arena_destruct_object<std::__cxx11::string>);
  }
  iVar2 = *(int *)&p_Var6->_M_parent;
  *(int *)&p_Var6->_M_parent = iVar2 + 1;
  (&p_Var6->_M_left->_M_parent)[iVar2] = p_Var7;
  return (string *)p_Var7;
}

Assistant:

string* ExtensionSet::AddString(int number, FieldType type,
                                const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_STRING);
    extension->is_repeated = true;
    extension->is_packed = false;
    extension->repeated_string_value =
        Arena::CreateMessage<RepeatedPtrField<string> >(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED, STRING);
  }
  return extension->repeated_string_value->Add();
}